

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc2c.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  istream *input_stream_00;
  long in_RSI;
  int in_EDI;
  bool bVar5;
  ostringstream error_message_7;
  ostringstream error_message_6;
  vector<double,_std::allocator<double>_> cepstrum;
  vector<double,_std::allocator<double>_> linear_predictive_coefficients;
  int output_length;
  int input_length;
  ostringstream error_message_5;
  LinearPredictiveCoefficientsToCepstrum linear_predictive_coefficients_to_cepstrum;
  istream *input_stream;
  ostringstream error_message_4;
  ifstream ifs;
  ostringstream error_message_3;
  char *input_file;
  ostringstream error_message_2;
  int num_input_files;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  int num_output_order;
  int num_input_order;
  option *in_stack_ffffffffffffeee8;
  int *in_stack_ffffffffffffeef0;
  string *in_stack_ffffffffffffeef8;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffef00;
  int in_stack_ffffffffffffef04;
  size_type in_stack_ffffffffffffef08;
  undefined6 in_stack_ffffffffffffef10;
  undefined1 in_stack_ffffffffffffef16;
  undefined1 in_stack_ffffffffffffef17;
  int *actual_write_size;
  vector<double,_std::allocator<double>_> *sequence_to_read;
  LinearPredictiveCoefficientsToCepstrum *in_stack_ffffffffffffef38;
  int in_stack_ffffffffffffef40;
  undefined1 in_stack_ffffffffffffef46;
  char *local_10b8;
  undefined7 in_stack_ffffffffffffef50;
  char *local_1070;
  bool local_100a;
  allocator local_ff1;
  string local_ff0 [32];
  ostringstream local_fd0 [168];
  ostringstream *in_stack_fffffffffffff0d8;
  string *in_stack_fffffffffffff0e0;
  allocator local_e51;
  string local_e50 [32];
  ostringstream local_e30 [383];
  int local_cb1 [8];
  vector<double,_std::allocator<double>_> local_c91;
  int local_c74;
  int local_c70;
  allocator local_c69;
  string local_c68 [32];
  ostringstream local_c48 [376];
  LinearPredictiveCoefficientsToCepstrum local_ad0;
  char *local_ab8;
  undefined4 local_ab0;
  allocator local_aa9;
  string local_aa8 [32];
  ostringstream local_a88 [376];
  char local_910 [527];
  allocator local_701;
  string local_700 [32];
  ostringstream local_6e0 [376];
  char *local_568;
  allocator local_559;
  string local_558 [32];
  ostringstream local_538 [376];
  int local_3c0;
  allocator local_3b9;
  string local_3b8 [32];
  ostringstream local_398 [383];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  ostringstream local_1d0 [399];
  allocator local_41;
  string local_40 [36];
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 0x19;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_1c = ya_getopt_long(in_stack_ffffffffffffef04,(char **)in_stack_ffffffffffffeef8,
                                   (char *)in_stack_ffffffffffffeef0,in_stack_ffffffffffffeee8,
                                   (int *)0x10370a), pcVar1 = ya_optarg, local_1c != -1) {
    if (local_1c == 0x4d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,pcVar1,&local_219);
      bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0);
      bVar5 = local_18 < 0;
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      if (!bVar2 || bVar5) {
        std::__cxx11::ostringstream::ostringstream(local_398);
        poVar4 = std::operator<<((ostream *)local_398,"The argument for the -M option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"lpc2c",&local_3b9);
        sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_398);
        return local_4;
      }
    }
    else {
      if (local_1c == 0x68) {
        anon_unknown.dwarf_1728::PrintUsage
                  ((ostream *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
        return 0;
      }
      if (local_1c != 0x6d) {
        anon_unknown.dwarf_1728::PrintUsage
                  ((ostream *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
        return 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,pcVar1,&local_41);
      bVar2 = sptk::ConvertStringToInteger(in_stack_ffffffffffffeef8,in_stack_ffffffffffffeef0);
      local_100a = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      if (local_100a) {
        std::__cxx11::ostringstream::ostringstream(local_1d0);
        poVar4 = std::operator<<((ostream *)local_1d0,"The argument for the -m option must be a ");
        std::operator<<(poVar4,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f0,"lpc2c",&local_1f1);
        sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d0);
        return local_4;
      }
    }
  }
  local_3c0 = local_8 - ya_optind;
  if (1 < local_3c0) {
    std::__cxx11::ostringstream::ostringstream(local_538);
    std::operator<<((ostream *)local_538,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_558,"lpc2c",&local_559);
    sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string(local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_559);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_538);
    return local_4;
  }
  if (local_3c0 == 0) {
    local_1070 = (char *)0x0;
  }
  else {
    local_1070 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_568 = local_1070;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_6e0);
    std::operator<<((ostream *)local_6e0,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_700,"lpc2c",&local_701);
    sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string(local_700);
    std::allocator<char>::~allocator((allocator<char> *)&local_701);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_6e0);
    return local_4;
  }
  std::ifstream::ifstream(local_910);
  pcVar1 = local_568;
  if (local_568 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_910,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_a88);
      poVar4 = std::operator<<((ostream *)local_a88,"Cannot open file ");
      std::operator<<(poVar4,local_568);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa8,"lpc2c",&local_aa9);
      sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
      std::__cxx11::string::~string(local_aa8);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa9);
      local_4 = 1;
      local_ab0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a88);
      goto LAB_001046bc;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_10b8 = (char *)&std::cin;
  }
  else {
    local_10b8 = local_910;
  }
  local_ab8 = local_10b8;
  sptk::LinearPredictiveCoefficientsToCepstrum::LinearPredictiveCoefficientsToCepstrum
            (&local_ad0,local_14,local_18);
  bVar2 = sptk::LinearPredictiveCoefficientsToCepstrum::IsValid(&local_ad0);
  if (bVar2) {
    local_c70 = local_14 + 1;
    local_c74 = local_18 + 1;
    input_stream_00 = (istream *)(long)local_c70;
    sequence_to_read = &local_c91;
    std::allocator<double>::allocator((allocator<double> *)0x1042ac);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffef17,
                        CONCAT16(in_stack_ffffffffffffef16,in_stack_ffffffffffffef10)),
               in_stack_ffffffffffffef08,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
    std::allocator<double>::~allocator((allocator<double> *)0x1042d2);
    actual_write_size = local_cb1;
    std::allocator<double>::allocator((allocator<double> *)0x1042f1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffef17,
                        CONCAT16(in_stack_ffffffffffffef16,in_stack_ffffffffffffef10)),
               in_stack_ffffffffffffef08,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
    std::allocator<double>::~allocator((allocator<double> *)0x104317);
    do {
      bVar2 = sptk::ReadStream<double>
                        ((bool)in_stack_ffffffffffffef46,in_stack_ffffffffffffef40,
                         (int)((ulong)in_stack_ffffffffffffef38 >> 0x20),
                         (int)in_stack_ffffffffffffef38,sequence_to_read,input_stream_00,
                         (int *)CONCAT17(bVar3,in_stack_ffffffffffffef50));
      if (!bVar2) {
        local_4 = 0;
        local_ab0 = 1;
        goto LAB_00104666;
      }
      bVar2 = sptk::LinearPredictiveCoefficientsToCepstrum::Run
                        (in_stack_ffffffffffffef38,sequence_to_read,
                         (vector<double,_std::allocator<double>_> *)input_stream_00);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_e30);
        std::operator<<((ostream *)local_e30,
                        "Failed to convert linear predictive coefficients to cepstrum");
        paVar6 = &local_e51;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e50,"lpc2c",paVar6);
        sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
        std::__cxx11::string::~string(local_e50);
        std::allocator<char>::~allocator((allocator<char> *)&local_e51);
        local_4 = 1;
        local_ab0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e30);
        goto LAB_00104666;
      }
      bVar2 = sptk::WriteStream<double>
                        (in_stack_ffffffffffffef40,(int)((ulong)in_stack_ffffffffffffef38 >> 0x20),
                         sequence_to_read,(ostream *)input_stream_00,actual_write_size);
      in_stack_ffffffffffffef04 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffef04);
    } while (bVar2);
    std::__cxx11::ostringstream::ostringstream(local_fd0);
    std::operator<<((ostream *)local_fd0,"Failed to write cepstrum");
    paVar6 = &local_ff1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ff0,"lpc2c",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string(local_ff0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ff1);
    local_4 = 1;
    local_ab0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_fd0);
LAB_00104666:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffef04,in_stack_ffffffffffffef00));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_c48);
    std::operator<<((ostream *)local_c48,
                    "Failed to initialize LinearPredictiveCoefficientsToCepstrum");
    paVar6 = &local_c69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c68,"lpc2c",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    std::__cxx11::string::~string(local_c68);
    std::allocator<char>::~allocator((allocator<char> *)&local_c69);
    local_4 = 1;
    local_ab0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_c48);
  }
  sptk::LinearPredictiveCoefficientsToCepstrum::~LinearPredictiveCoefficientsToCepstrum(&local_ad0);
LAB_001046bc:
  std::ifstream::~ifstream(local_910);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_input_order(kDefaultNumInputOrder);
  int num_output_order(kDefaultNumOutputOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:M:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_input_order) ||
            num_input_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpc2c", error_message);
          return 1;
        }
        break;
      }
      case 'M': {
        if (!sptk::ConvertStringToInteger(optarg, &num_output_order) ||
            num_output_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -M option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lpc2c", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::LinearPredictiveCoefficientsToCepstrum
      linear_predictive_coefficients_to_cepstrum(num_input_order,
                                                 num_output_order);
  if (!linear_predictive_coefficients_to_cepstrum.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize LinearPredictiveCoefficientsToCepstrum";
    sptk::PrintErrorMessage("lpc2c", error_message);
    return 1;
  }

  const int input_length(num_input_order + 1);
  const int output_length(num_output_order + 1);
  std::vector<double> linear_predictive_coefficients(input_length);
  std::vector<double> cepstrum(output_length);

  while (sptk::ReadStream(false, 0, 0, input_length,
                          &linear_predictive_coefficients, &input_stream,
                          NULL)) {
    if (!linear_predictive_coefficients_to_cepstrum.Run(
            linear_predictive_coefficients, &cepstrum)) {
      std::ostringstream error_message;
      error_message
          << "Failed to convert linear predictive coefficients to cepstrum";
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, output_length, cepstrum, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write cepstrum";
      sptk::PrintErrorMessage("lpc2c", error_message);
      return 1;
    }
  }

  return 0;
}